

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall adios2::core::Group::Group(Group *this,string *path,char delimiter,IO *io)

{
  bool bVar1;
  shared_ptr<adios2::core::Group::TreeMap> *this_00;
  undefined8 in_RCX;
  string in_DL;
  string *in_RSI;
  string *in_RDI;
  TreeMap *in_stack_ffffffffffffff78;
  shared_ptr<adios2::core::Group::TreeMap> *in_stack_ffffffffffffff80;
  allocator local_21;
  undefined8 local_20;
  string local_11;
  
  local_20 = in_RCX;
  local_11 = in_DL;
  std::__cxx11::string::string(in_RDI,in_RSI);
  in_RDI[0x20] = local_11;
  std::shared_ptr<adios2::core::Group::TreeMap>::shared_ptr
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x38,"_ADIOS_ROOT_",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::shared_ptr<adios2::core::Group>::shared_ptr((shared_ptr<adios2::core::Group> *)0x96c839);
  *(undefined8 *)(in_RDI + 0x68) = local_20;
  bVar1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    this_00 = (shared_ptr<adios2::core::Group::TreeMap> *)operator_new(0x30);
    this_00[2].super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this_00[2].super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00[1].super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this_00[1].super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this_00->super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (this_00->super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    TreeMap::TreeMap((TreeMap *)0x96c886);
    std::shared_ptr<adios2::core::Group::TreeMap>::shared_ptr<adios2::core::Group::TreeMap,void>
              (this_00,in_stack_ffffffffffffff78);
    std::shared_ptr<adios2::core::Group::TreeMap>::operator=
              (this_00,(shared_ptr<adios2::core::Group::TreeMap> *)in_stack_ffffffffffffff78);
    std::shared_ptr<adios2::core::Group::TreeMap>::~shared_ptr
              ((shared_ptr<adios2::core::Group::TreeMap> *)0x96c8b4);
  }
  return;
}

Assistant:

Group::Group(std::string path, char delimiter, IO &io)
: currentPath(path), groupDelimiter(delimiter), m_IO(io)
{
    if (mapPtr == nullptr)
    {
        mapPtr = std::shared_ptr<TreeMap>(new TreeMap());
    }
}